

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::vector<bidfx_public_api::price::pixie::FieldDef,std::allocator<bidfx_public_api::price::pixie::FieldDef>>,std::vector<bidfx_public_api::price::pixie::FieldDef,std::allocator<bidfx_public_api::price::pixie::FieldDef>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
          *lhs,vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
               *rhs)

{
  pointer pFVar1;
  char cVar2;
  pointer this_00;
  pointer pFVar4;
  AssertionResult AVar5;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  this_00 = (lhs->
            super__Vector_base<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (lhs->
           super__Vector_base<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pFVar4 = (rhs->
           super__Vector_base<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)pFVar1 - (long)this_00 ==
      (long)(rhs->
            super__Vector_base<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar4) {
    for (; this_00 != pFVar1; this_00 = this_00 + 0x30) {
      cVar2 = bidfx_public_api::price::pixie::FieldDef::operator==(this_00,pFVar4);
      if (cVar2 == '\0') goto LAB_001792f0;
      pFVar4 = pFVar4 + 0x30;
    }
    AVar5 = AssertionSuccess();
    sVar3 = AVar5.message_.ptr_;
  }
  else {
LAB_001792f0:
    AVar5 = CmpHelperEQFailure<std::vector<bidfx_public_api::price::pixie::FieldDef,std::allocator<bidfx_public_api::price::pixie::FieldDef>>,std::vector<bidfx_public_api::price::pixie::FieldDef,std::allocator<bidfx_public_api::price::pixie::FieldDef>>>
                      (this,lhs_expression,rhs_expression,lhs,rhs);
    sVar3 = AVar5.message_.ptr_;
  }
  AVar5.message_.ptr_ = sVar3.ptr_;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
GTEST_DISABLE_MSC_WARNINGS_PUSH_(4389 /* signed/unsigned mismatch */)
  if (lhs == rhs) {
    return AssertionSuccess();
  }
GTEST_DISABLE_MSC_WARNINGS_POP_()

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}